

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtQuantizedBvh.cpp
# Opt level: O1

void __thiscall
cbtQuantizedBvh::reportAabbOverlappingNodex
          (cbtQuantizedBvh *this,cbtNodeOverlapCallback *nodeCallback,cbtVector3 *aabbMin,
          cbtVector3 *aabbMax)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  cbtTraversalMode cVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  unsigned_short quantizedQueryAabbMax [3];
  unsigned_short quantizedQueryAabbMin [3];
  ushort local_c;
  ushort local_a;
  ushort local_8;
  ushort local_6;
  ushort local_4;
  ushort local_2;
  
  if (this->m_useQuantization == true) {
    fVar1 = (this->m_bvhAabbMin).m_floats[0];
    fVar2 = (this->m_bvhAabbMin).m_floats[1];
    auVar8 = vmaxss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)aabbMin->m_floats[0]));
    auVar9 = vmaxss_avx(ZEXT416((uint)fVar2),ZEXT416((uint)aabbMin->m_floats[1]));
    fVar3 = (this->m_bvhAabbMin).m_floats[2];
    auVar10 = vmaxss_avx(ZEXT416((uint)fVar3),ZEXT416((uint)aabbMin->m_floats[2]));
    auVar11 = ZEXT416((uint)(this->m_bvhAabbMax).m_floats[0]);
    auVar8 = vminss_avx(auVar11,auVar8);
    auVar12 = ZEXT416((uint)(this->m_bvhAabbMax).m_floats[1]);
    auVar9 = vminss_avx(auVar12,auVar9);
    auVar13 = ZEXT416((uint)(this->m_bvhAabbMax).m_floats[2]);
    auVar10 = vminss_avx(auVar13,auVar10);
    fVar4 = (this->m_bvhQuantization).m_floats[0];
    fVar5 = (this->m_bvhQuantization).m_floats[1];
    fVar6 = (this->m_bvhQuantization).m_floats[2];
    local_6 = (ushort)(int)(fVar4 * (auVar8._0_4_ - fVar1)) & 0xfffe;
    local_4 = (ushort)(int)(fVar5 * (auVar9._0_4_ - fVar2)) & 0xfffe;
    local_2 = (ushort)(int)(fVar6 * (auVar10._0_4_ - fVar3)) & 0xfffe;
    auVar8 = vmaxss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)aabbMax->m_floats[0]));
    auVar9 = vmaxss_avx(ZEXT416((uint)fVar2),ZEXT416((uint)aabbMax->m_floats[1]));
    auVar10 = vmaxss_avx(ZEXT416((uint)fVar3),ZEXT416((uint)aabbMax->m_floats[2]));
    auVar8 = vminss_avx(auVar11,auVar8);
    auVar9 = vminss_avx(auVar12,auVar9);
    auVar10 = vminss_avx(auVar13,auVar10);
    local_c = (ushort)(int)(fVar4 * (auVar8._0_4_ - fVar1) + 1.0) | 1;
    local_a = (ushort)(int)(fVar5 * (auVar9._0_4_ - fVar2) + 1.0) | 1;
    local_8 = (ushort)(int)(fVar6 * (auVar10._0_4_ - fVar3) + 1.0) | 1;
    cVar7 = this->m_traversalMode;
    if (cVar7 == TRAVERSAL_RECURSIVE) {
      walkRecursiveQuantizedTreeAgainstQueryAabb
                (this,(this->m_quantizedContiguousNodes).m_data,nodeCallback,&local_6,&local_c);
    }
    else if (cVar7 == TRAVERSAL_STACKLESS_CACHE_FRIENDLY) {
      walkStacklessQuantizedTreeCacheFriendly(this,nodeCallback,&local_6,&local_c);
    }
    else if (cVar7 == TRAVERSAL_STACKLESS) {
      walkStacklessQuantizedTree(this,nodeCallback,&local_6,&local_c,0,this->m_curNodeIndex);
    }
    return;
  }
  walkStacklessTree(this,nodeCallback,aabbMin,aabbMax);
  return;
}

Assistant:

void cbtQuantizedBvh::reportAabbOverlappingNodex(cbtNodeOverlapCallback* nodeCallback, const cbtVector3& aabbMin, const cbtVector3& aabbMax) const
{
	//either choose recursive traversal (walkTree) or stackless (walkStacklessTree)

	if (m_useQuantization)
	{
		///quantize query AABB
		unsigned short int quantizedQueryAabbMin[3];
		unsigned short int quantizedQueryAabbMax[3];
		quantizeWithClamp(quantizedQueryAabbMin, aabbMin, 0);
		quantizeWithClamp(quantizedQueryAabbMax, aabbMax, 1);

		switch (m_traversalMode)
		{
			case TRAVERSAL_STACKLESS:
				walkStacklessQuantizedTree(nodeCallback, quantizedQueryAabbMin, quantizedQueryAabbMax, 0, m_curNodeIndex);
				break;
			case TRAVERSAL_STACKLESS_CACHE_FRIENDLY:
				walkStacklessQuantizedTreeCacheFriendly(nodeCallback, quantizedQueryAabbMin, quantizedQueryAabbMax);
				break;
			case TRAVERSAL_RECURSIVE:
			{
				const cbtQuantizedBvhNode* rootNode = &m_quantizedContiguousNodes[0];
				walkRecursiveQuantizedTreeAgainstQueryAabb(rootNode, nodeCallback, quantizedQueryAabbMin, quantizedQueryAabbMax);
			}
			break;
			default:
				//unsupported
				cbtAssert(0);
		}
	}
	else
	{
		walkStacklessTree(nodeCallback, aabbMin, aabbMax);
	}
}